

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterstate.cpp
# Opt level: O0

bool __thiscall
YAML::EmitterState::SetFlowType(EmitterState *this,value groupType,EMITTER_MANIP value,value scope)

{
  int in_EDX;
  value in_stack_00000030;
  EMITTER_MANIP in_stack_00000034;
  Setting<YAML::EMITTER_MANIP> *in_stack_00000038;
  EmitterState *in_stack_00000040;
  bool local_1;
  
  if (in_EDX == 0x1c || in_EDX == 0x1d) {
    _Set<YAML::EMITTER_MANIP>
              (in_stack_00000040,in_stack_00000038,in_stack_00000034,in_stack_00000030);
  }
  local_1 = in_EDX == 0x1c || in_EDX == 0x1d;
  return local_1;
}

Assistant:

bool EmitterState::SetFlowType(GroupType::value groupType, EMITTER_MANIP value,
                               FmtScope::value scope) {
  switch (value) {
    case Block:
    case Flow:
      _Set(groupType == GroupType::Seq ? m_seqFmt : m_mapFmt, value, scope);
      return true;
    default:
      return false;
  }
}